

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O1

void printNode<cpprofiler::Node&>(Node *node,ostream *os)

{
  ostream *poVar1;
  NodeUID local_38;
  NodeUID local_28;
  
  local_28.nid = (node->node_).nid;
  local_28.rid = (node->node_).rid;
  local_28.tid = (node->node_).tid;
  poVar1 = operator<<(os,&local_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", parent: ",10);
  local_38.nid = (node->parent_).nid;
  local_38.rid = (node->parent_).rid;
  local_38.tid = (node->parent_).tid;
  poVar1 = operator<<(poVar1,&local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", alt: ",7);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,node->alt_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", kids: ",8);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,node->kids_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", status: ",10);
  std::ostream::operator<<((ostream *)poVar1,node->status_);
  if ((node->label_).present == true) {
    std::__ostream_insert<char,std::char_traits<char>>(os,", label: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,(node->label_).value_._M_dataplus._M_p,(node->label_).value_._M_string_length);
  }
  if ((node->nogood_).present == true) {
    std::__ostream_insert<char,std::char_traits<char>>(os,", nogood: ",10);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,(node->nogood_).value_._M_dataplus._M_p,(node->nogood_).value_._M_string_length);
  }
  if ((node->info_).present == true) {
    std::__ostream_insert<char,std::char_traits<char>>(os,", info: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,(node->info_).value_._M_dataplus._M_p,(node->info_).value_._M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  return;
}

Assistant:

static void printNode(T&& node, std::ostream& os) {
	os << node.nodeUID() << ", parent: " << node.parentUID() << ", alt: " << node.alt()
		 << ", kids: " << node.kids() << ", status: " << node.status();
	if (node.label().valid()) {
		os << ", label: " << node.label().value();
	}
	if (node.nogood().valid()) {
		os << ", nogood: " << node.nogood().value();
	}
	if (node.info().valid()) {
		os << ", info: " << node.info().value();
	}
	os << "\n";
}